

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall
ot::commissioner::Interpreter::PrintNetworkMessage
          (Interpreter *this,uint64_t aNid,string *aMessage,Color aColor)

{
  pointer pcVar1;
  Interpreter *this_00;
  string nidHex;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  string local_40;
  
  utils::Hex<unsigned_long>(&local_40,aNid);
  local_60._0_8_ = (pointer)(local_60 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + (long)(_Alloc_hider *)local_40._M_string_length);
  pcVar1 = (aMessage->_M_dataplus)._M_p;
  this_00 = (Interpreter *)local_80;
  local_80._0_8_ = (pointer)(local_80 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00,pcVar1,pcVar1 + aMessage->_M_string_length);
  PrintNetworkMessage(this_00,(string *)local_60,(string *)local_80,aColor);
  if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_);
  }
  if ((pointer)local_60._0_8_ != (pointer)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Interpreter::PrintNetworkMessage(uint64_t aNid, std::string aMessage, Console::Color aColor)
{
    std::string nidHex = utils::Hex(aNid);
    PrintNetworkMessage(nidHex, aMessage, aColor);
}